

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void idx(item *x,item *y)

{
  int a;
  typeDesc *ptVar1;
  typeDesc *type;
  int r;
  item *y_local;
  item *x_local;
  
  if (y->typeIndex != intTypeIndex) {
    mark("index not an integer");
    exit(-1);
  }
  ptVar1 = getType(x->typeIndex);
  if (x->alr == 0) {
    if (y->mode == 0x2bd) {
      if ((y->a < 0) || (ptVar1->len <= y->a)) {
        mark("index out of range");
        exit(-1);
      }
      x->a = x->a + y->a * ptVar1->base->size;
    }
    else {
      if (y->mode != 0x2c2) {
        load(y);
      }
      put(0x1e,y->r,0,ptVar1->len);
      put(0x12,y->r,y->r,ptVar1->base->size);
      if (x->r != 0) {
        put(0,y->r,x->r,y->r);
        regs[x->r] = 0;
      }
      x->r = y->r;
    }
  }
  else if (y->mode == 0x2bd) {
    a = getReg();
    put(0x10,a,0,y->a);
    put(0xe,a,0,x->alr);
    put(0x12,a,a,ptVar1->base->size);
    if (x->r != 0) {
      put(0,a,x->r,a);
      regs[x->r] = 0;
    }
    x->r = a;
    regs[x->alr] = 0;
  }
  else {
    if (y->mode != 0x2c2) {
      load(y);
    }
    put(0xe,y->r,0,x->alr);
    put(0x12,y->r,y->r,ptVar1->base->size);
    if (x->r != 0) {
      put(0,y->r,x->r,y->r);
      regs[x->r] = 0;
    }
    x->r = y->r;
    regs[x->alr] = 0;
  }
  x->typeIndex = ptVar1->base->index;
  return;
}

Assistant:

procedure 
void idx(struct item *x, struct item *y) {
	variable int r;
	variable struct typeDesc *type;
	type=NULL; r = 0;
	if (y->typeIndex != intTypeIndex) {
		mark("index not an integer");
		exit(-1);
	}
	type = getType(x->typeIndex);

	 /* array is given as parameter */
	if (x->alr != 0) {
		if (y->mode == CLASS_CONST) {
			r = getReg();
			put(RISC_ADDI,r,0,y->a); 
			put(RISC_CHK,r,0,x->alr); 

			put(RISC_MULI,r,r,type->base->size);
			if (x->r != 0) { 
			
				/* R[r] := FP/global + R[r] */
				put(RISC_ADD,r,x->r,r); 
				regs[x->r] = 0;
			}
			x->r = r;
			regs[x->alr] = 0;
		} else {
			if (y->mode != CLASS_REG) {
				load(y);
			}
			put(RISC_CHK,y->r,0,x->alr);
			put(RISC_MULI,y->r,y->r,type->base->size);
			if (x->r != 0) {
				put(RISC_ADD,y->r,x->r,y->r);
				regs[x->r] = 0;
			}
			x->r = y->r;
			regs[x->alr] = 0;
		}
	} else {
		if (y->mode == CLASS_CONST) {
			if ((y->a < 0) || (y->a >= type->len)) {
				mark("index out of range");
				exit(-1);
			}
			x->a = x->a + y->a * type->base->size; /* fix */
		} else {
			if (y->mode != CLASS_REG) {
				load(y);
			}
			put(RISC_CHKI,y->r,0,type->len);
			put(RISC_MULI,y->r,y->r,type->base->size);
			if (x->r != 0) {
				put(RISC_ADD,y->r,x->r,y->r);
				regs[x->r] = 0;
			}
			x->r = y->r;
		}
	}
	x->typeIndex = type->base->index;
}